

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

FileMetaData *
leveldb::FindSmallestBoundaryFile
          (InternalKeyComparator *icmp,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *level_files,
          InternalKey *largest_key)

{
  value_type pFVar1;
  int iVar2;
  InternalKey *this;
  InternalKeyComparator *pIVar3;
  const_reference ppFVar4;
  long in_FS_OFFSET;
  FileMetaData *f;
  size_t i;
  FileMetaData *smallest_boundary_file;
  Comparator *user_cmp;
  InternalKeyComparator *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff80;
  InternalKey *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  InternalKeyComparator *this_00;
  InternalKeyComparator *local_58;
  value_type local_50;
  Slice local_28;
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (InternalKey *)InternalKeyComparator::user_comparator(in_stack_ffffffffffffff78);
  local_50 = (value_type)0x0;
  local_58 = (InternalKeyComparator *)0x0;
  while (this_00 = local_58,
        pIVar3 = (InternalKeyComparator *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      in_stack_ffffffffffffff78), this_00 < pIVar3) {
    ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    pFVar1 = *ppFVar4;
    iVar2 = InternalKeyComparator::Compare
                      (this_00,(InternalKey *)
                               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff97 = false;
    if (0 < iVar2) {
      in_stack_ffffffffffffff88 = this;
      local_18 = InternalKey::user_key(this);
      local_28 = InternalKey::user_key(in_stack_ffffffffffffff88);
      iVar2 = (**(code **)((in_stack_ffffffffffffff88->rep_)._M_dataplus._M_p + 0x10))
                        (in_stack_ffffffffffffff88,&local_18,&local_28);
      in_stack_ffffffffffffff97 = iVar2 == 0;
    }
    if (((bool)in_stack_ffffffffffffff97 != false) &&
       ((local_50 == (value_type)0x0 ||
        (iVar2 = InternalKeyComparator::Compare
                           (this_00,(InternalKey *)
                                    CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88), iVar2 < 0)))) {
      local_50 = pFVar1;
    }
    local_58 = (InternalKeyComparator *)((long)&(local_58->super_Comparator)._vptr_Comparator + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

FileMetaData* FindSmallestBoundaryFile(
    const InternalKeyComparator& icmp,
    const std::vector<FileMetaData*>& level_files,
    const InternalKey& largest_key) {
  const Comparator* user_cmp = icmp.user_comparator();
  FileMetaData* smallest_boundary_file = nullptr;
  for (size_t i = 0; i < level_files.size(); ++i) {
    FileMetaData* f = level_files[i];
    if (icmp.Compare(f->smallest, largest_key) > 0 &&
        user_cmp->Compare(f->smallest.user_key(), largest_key.user_key()) ==
            0) {
      if (smallest_boundary_file == nullptr ||
          icmp.Compare(f->smallest, smallest_boundary_file->smallest) < 0) {
        smallest_boundary_file = f;
      }
    }
  }
  return smallest_boundary_file;
}